

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int allocno_info_compare_func(void *a1,void *a2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  allocno_info_t *allocno_info2;
  allocno_info_t *allocno_info1;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  lVar1 = *(long *)((long)a1 + 8);
  if (lVar1 != *(long *)((long)a2 + 8)) {
    __assert_fail("reg_infos == allocno_info2->reg_infos",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1c74,"int allocno_info_compare_func(const void *, const void *)");
  }
  bVar9 = *(int *)((long)a1 + 4) != 0;
  if (*(int *)((long)a2 + 4) != 0) {
LAB_00142911:
    return -(uint)bVar9 | 1;
  }
  lVar7 = (ulong)*a2 * 0x10;
  lVar8 = (ulong)*a1 * 0x10;
  lVar2 = *(long *)(lVar1 + lVar7);
  lVar3 = *(long *)(lVar1 + lVar8);
  if (lVar2 != lVar3) {
    return (int)lVar2 - (int)lVar3;
  }
  uVar4 = *(ulong *)(lVar7 + lVar1 + 8);
  uVar5 = *(ulong *)(lVar8 + lVar1 + 8);
  if (uVar4 < uVar5) {
    iVar6 = -1;
  }
  else {
    if (uVar4 <= uVar5) {
      bVar9 = *a1 < *a2;
      goto LAB_00142911;
    }
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static int allocno_info_compare_func (const void *a1, const void *a2) {
  const allocno_info_t *allocno_info1 = (const allocno_info_t *) a1,
                       *allocno_info2 = (const allocno_info_t *) a2;
  MIR_reg_t reg1 = allocno_info1->reg, reg2 = allocno_info2->reg;
  reg_info_t *reg_infos = allocno_info1->reg_infos;
  long diff;

  gen_assert (reg_infos == allocno_info2->reg_infos);
  if (allocno_info1->tied_reg_p) {
    if (allocno_info2->tied_reg_p) return -1;
  } else if (allocno_info2->tied_reg_p) {
    return 1;
  }
  if ((diff = reg_infos[reg2].freq - reg_infos[reg1].freq) != 0) return diff;
  if (reg_infos[reg2].live_length < reg_infos[reg1].live_length) return -1;
  if (reg_infos[reg1].live_length < reg_infos[reg2].live_length) return 1;
  return reg1 < reg2 ? -1 : 1; /* make sort stable */
}